

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereSphereCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btSphereSphereCollisionAlgorithm::btSphereSphereCollisionAlgorithm
          (btSphereSphereCollisionAlgorithm *this,btPersistentManifold *mf,
          btCollisionAlgorithmConstructionInfo *ci,btCollisionObjectWrapper *col0Wrap,
          btCollisionObjectWrapper *col1Wrap)

{
  btDispatcher *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            (&this->super_btActivatingCollisionAlgorithm,ci,col0Wrap,col1Wrap);
  (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm._vptr_btCollisionAlgorithm
       = (_func_int **)&PTR__btSphereSphereCollisionAlgorithm_0021cb60;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  if (mf == (btPersistentManifold *)0x0) {
    pbVar1 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
    iVar2 = (*pbVar1->_vptr_btDispatcher[3])
                      (pbVar1,col0Wrap->m_collisionObject,col1Wrap->m_collisionObject);
    this->m_manifoldPtr = (btPersistentManifold *)CONCAT44(extraout_var,iVar2);
    this->m_ownManifold = true;
  }
  return;
}

Assistant:

btSphereSphereCollisionAlgorithm::btSphereSphereCollisionAlgorithm(btPersistentManifold* mf,const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* col0Wrap,const btCollisionObjectWrapper* col1Wrap)
: btActivatingCollisionAlgorithm(ci,col0Wrap,col1Wrap),
m_ownManifold(false),
m_manifoldPtr(mf)
{
	if (!m_manifoldPtr)
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(col0Wrap->getCollisionObject(),col1Wrap->getCollisionObject());
		m_ownManifold = true;
	}
}